

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_psbt.cpp
# Opt level: O2

void __thiscall
cfd::core::Psbt::SetTxInFinalScript
          (Psbt *this,uint32_t index,
          vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> *unlocking_script)

{
  void *pvVar1;
  pointer pBVar2;
  ByteData *pBVar3;
  ulong uVar4;
  bool bVar5;
  bool bVar6;
  long lVar7;
  CfdException *pCVar8;
  pointer __x;
  undefined4 in_register_00000034;
  ByteData *bytedata;
  bool is_witness;
  int ret;
  allocator local_2c1;
  vector<unsigned_char,_std::allocator<unsigned_char>_> script_val;
  value_type last_stack;
  ByteData script;
  wally_tx_witness_stack *stacks;
  Script script_sig;
  Script redeem_script;
  TxOut utxo;
  
  uVar4 = (ulong)index;
  (*this->_vptr_Psbt[2])(this,CONCAT44(in_register_00000034,index),0x974,"SetTxInFinalScript");
  if ((unlocking_script->
      super__Vector_base<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>)._M_impl.
      super__Vector_impl_data._M_start ==
      (unlocking_script->
      super__Vector_base<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>)._M_impl.
      super__Vector_impl_data._M_finish) {
    script_sig._vptr_Script = (_func_int **)0x22e1c0;
    script_sig.script_data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
    _M_impl.super__Vector_impl_data._M_start._0_4_ = 0x979;
    script_sig.script_data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
    _M_impl.super__Vector_impl_data._M_finish = "SetTxInFinalScript";
    logger::warn<>((CfdSourceLocation *)&script_sig,"unlocking script is empty.");
    pCVar8 = (CfdException *)__cxa_allocate_exception(0x30);
    ::std::__cxx11::string::string
              ((string *)&script_sig,"psbt unlocking script is empty.",(allocator *)&utxo);
    CfdException::CfdException(pCVar8,kCfdIllegalArgumentError,(string *)&script_sig);
    __cxa_throw(pCVar8,&CfdException::typeinfo,CfdException::~CfdException);
  }
  pvVar1 = this->wally_psbt_pointer_;
  is_witness = false;
  GetTxInRedeemScript(&redeem_script,this,index,true,(bool *)0x0);
  GetTxInUtxo(&utxo,this,index,true,&is_witness);
  if (is_witness == true) {
    ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&last_stack,
               &(unlocking_script->
                super__Vector_base<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>).
                _M_impl.super__Vector_impl_data._M_finish[-1].data_);
    Script::GetData((ByteData *)&script_sig,&redeem_script);
    bVar5 = ByteData::Equals((ByteData *)&script_sig,&last_stack);
    ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
              ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&script_sig);
    if (!bVar5) {
      bVar6 = Pubkey::IsValid(&last_stack);
      if (!bVar6) {
        script_sig._vptr_Script = (_func_int **)0x22e1c0;
        script_sig.script_data_.data_.
        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start._0_4_ = 0x98a;
        script_sig.script_data_.data_.
        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_finish = "SetTxInFinalScript";
        logger::warn<>((CfdSourceLocation *)&script_sig,"invalid unlocking_script.");
        pCVar8 = (CfdException *)__cxa_allocate_exception(0x30);
        ::std::__cxx11::string::string
                  ((string *)&script_sig,"psbt invalid unlocking_script error.",(allocator *)&script
                  );
        CfdException::CfdException(pCVar8,kCfdIllegalArgumentError,(string *)&script_sig);
        __cxa_throw(pCVar8,&CfdException::typeinfo,CfdException::~CfdException);
      }
    }
    stacks = (wally_tx_witness_stack *)0x0;
    lVar7 = (long)(unlocking_script->
                  super__Vector_base<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>).
                  _M_impl.super__Vector_impl_data._M_finish -
            (long)(unlocking_script->
                  super__Vector_base<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>).
                  _M_impl.super__Vector_impl_data._M_start;
    ret = wally_tx_witness_stack_init_alloc(lVar7 / 0x18,&stacks,lVar7 % 0x18);
    if (ret != 0) {
      script_sig._vptr_Script = (_func_int **)0x22e1c0;
      script_sig.script_data_.data_.
      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start._0_4_ = 0x992;
      script_sig.script_data_.data_.
      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish = "SetTxInFinalScript";
      logger::warn<int&>((CfdSourceLocation *)&script_sig,"wally_tx_witness_stack_init_alloc NG[{}]"
                         ,&ret);
      pCVar8 = (CfdException *)__cxa_allocate_exception(0x30);
      ::std::__cxx11::string::string
                ((string *)&script_sig,"psbt init witness stack error.",(allocator *)&script);
      CfdException::CfdException(pCVar8,kCfdIllegalArgumentError,(string *)&script_sig);
      __cxa_throw(pCVar8,&CfdException::typeinfo,CfdException::~CfdException);
    }
    pBVar2 = (unlocking_script->
             super__Vector_base<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>)._M_impl.
             super__Vector_impl_data._M_finish;
    ret = 0;
    for (__x = (unlocking_script->
               super__Vector_base<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>).
               _M_impl.super__Vector_impl_data._M_start; __x != pBVar2; __x = __x + 1) {
      ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&script,&__x->data_);
      ByteData::GetBytes((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                         &script_val.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>,&script)
      ;
      ret = wally_tx_witness_stack_add
                      (stacks,script_val.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_start,
                       (long)script_val.
                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                             _M_impl.super__Vector_impl_data._M_finish -
                       (long)script_val.
                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                             _M_impl.super__Vector_impl_data._M_start);
      if (ret != 0) {
        wally_tx_witness_stack_free(stacks);
        script_sig._vptr_Script = (_func_int **)0x22e1c0;
        script_sig.script_data_.data_.
        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start._0_4_ = 0x99c;
        script_sig.script_data_.data_.
        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_finish = "SetTxInFinalScript";
        logger::warn<int&>((CfdSourceLocation *)&script_sig,"wally_tx_witness_stack_add NG[{}]",&ret
                          );
        pCVar8 = (CfdException *)__cxa_allocate_exception(0x30);
        ::std::__cxx11::string::string
                  ((string *)&script_sig,"psbt add witness stack error.",&local_2c1);
        CfdException::CfdException(pCVar8,kCfdIllegalArgumentError,(string *)&script_sig);
        __cxa_throw(pCVar8,&CfdException::typeinfo,CfdException::~CfdException);
      }
      ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                (&script_val.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
      ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&script);
    }
    ret = wally_psbt_input_set_final_witness(uVar4 * 0x110 + *(long *)((long)pvVar1 + 0x10),stacks);
    wally_tx_witness_stack_free(stacks);
    if (ret != 0) {
      script_sig._vptr_Script = (_func_int **)0x22e1c0;
      script_sig.script_data_.data_.
      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start._0_4_ = 0x9a6;
      script_sig.script_data_.data_.
      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish = "SetTxInFinalScript";
      logger::warn<int&>((CfdSourceLocation *)&script_sig,
                         "wally_psbt_input_set_final_witness NG[{}]",&ret);
      pCVar8 = (CfdException *)__cxa_allocate_exception(0x30);
      ::std::__cxx11::string::string
                ((string *)&script_sig,"psbt set witness script error.",(allocator *)&script);
      CfdException::CfdException(pCVar8,kCfdIllegalArgumentError,(string *)&script_sig);
      __cxa_throw(pCVar8,&CfdException::typeinfo,CfdException::~CfdException);
    }
    ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
              ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&last_stack);
  }
  else {
    Script::Script(&script_sig);
    bytedata = (unlocking_script->
               super__Vector_base<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>).
               _M_impl.super__Vector_impl_data._M_start;
    pBVar3 = (unlocking_script->
             super__Vector_base<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>)._M_impl.
             super__Vector_impl_data._M_finish;
    if ((long)pBVar3 - (long)bytedata == 0x18) {
      Script::Script((Script *)&last_stack,bytedata);
      Script::operator=(&script_sig,(Script *)&last_stack);
      Script::~Script((Script *)&last_stack);
    }
    else {
      script.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)&PTR__ScriptBuilder_002769d8;
      script.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      script.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      for (; bytedata != pBVar3; bytedata = bytedata + 1) {
        ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                  ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&last_stack,
                   &bytedata->data_);
        ByteData::GetBytes((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                           &script_val.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>,
                           (ByteData *)&last_stack);
        if ((long)script_val.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                  _M_impl.super__Vector_impl_data._M_finish -
            (long)script_val.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                  _M_impl.super__Vector_impl_data._M_start == 1) {
          ScriptBuilder::AppendOperator
                    ((ScriptBuilder *)&script,
                     (uint)*script_val.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_start);
        }
        else {
          ScriptBuilder::AppendData((ScriptBuilder *)&script,(ByteData *)&last_stack);
        }
        ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                  (&script_val.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
        ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                  ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&last_stack);
      }
      ScriptBuilder::Build((Script *)&last_stack,(ScriptBuilder *)&script);
      Script::operator=(&script_sig,(Script *)&last_stack);
      Script::~Script((Script *)&last_stack);
      ScriptBuilder::~ScriptBuilder((ScriptBuilder *)&script);
    }
    Script::GetData(&last_stack,&script_sig);
    ByteData::GetBytes(&script.data_,&last_stack);
    ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
              ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&last_stack);
    ret = wally_psbt_input_set_final_scriptsig
                    (uVar4 * 0x110 + *(long *)((long)pvVar1 + 0x10),
                     script.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                     _M_impl.super__Vector_impl_data._M_start,
                     (long)script.data_.
                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                           .super__Vector_impl_data._M_finish -
                     (long)script.data_.
                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                           .super__Vector_impl_data._M_start);
    if (ret != 0) {
      last_stack.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start = "cfdcore_psbt.cpp";
      last_stack.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish._0_4_ = 0x9be;
      last_stack.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = "SetTxInFinalScript";
      logger::warn<int&>((CfdSourceLocation *)&last_stack,
                         "wally_psbt_input_set_final_scriptsig NG[{}]",&ret);
      pCVar8 = (CfdException *)__cxa_allocate_exception(0x30);
      ::std::__cxx11::string::string
                ((string *)&last_stack,"psbt set scriptsig error.",(allocator *)&script_val);
      CfdException::CfdException(pCVar8,kCfdIllegalArgumentError,(string *)&last_stack);
      __cxa_throw(pCVar8,&CfdException::typeinfo,CfdException::~CfdException);
    }
    ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
              ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&script);
    Script::~Script(&script_sig);
    bVar5 = false;
  }
  if (is_witness == true) {
    AbstractTxOut::GetLockingScript(&script_sig,&utxo.super_AbstractTxOut);
    bVar6 = Script::IsP2shScript(&script_sig);
    Script::~Script(&script_sig);
    if (bVar6) {
      Script::Script((Script *)&last_stack);
      if (bVar5 == false) {
        bVar5 = Script::IsEmpty(&redeem_script);
        if (bVar5) {
          GetTxInKeyData((KeyData *)&script_sig,this,index,true);
          KeyData::GetPubkey((Pubkey *)&script_val,(KeyData *)&script_sig);
          ScriptUtil::CreateP2wpkhLockingScript((Script *)&script,(Pubkey *)&script_val);
          Script::operator=((Script *)&last_stack,(Script *)&script);
          Script::~Script((Script *)&script);
          ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                    (&script_val.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
          KeyData::~KeyData((KeyData *)&script_sig);
        }
        else {
          Script::operator=((Script *)&last_stack,&redeem_script);
        }
      }
      else {
        ScriptUtil::CreateP2wshLockingScript(&script_sig,&redeem_script);
        Script::operator=((Script *)&last_stack,&script_sig);
        Script::~Script(&script_sig);
      }
      script.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)&PTR__ScriptBuilder_002769d8;
      script.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      script.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      Script::GetData((ByteData *)&script_sig,(Script *)&last_stack);
      ScriptBuilder::AppendData((ScriptBuilder *)&script,(ByteData *)&script_sig);
      ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&script_sig);
      ScriptBuilder::Build(&script_sig,(ScriptBuilder *)&script);
      Script::GetData((ByteData *)&stacks,&script_sig);
      ByteData::GetBytes(&script_val,(ByteData *)&stacks);
      ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&stacks);
      Script::~Script(&script_sig);
      ret = wally_psbt_input_set_final_scriptsig
                      (uVar4 * 0x110 + *(long *)((long)pvVar1 + 0x10),
                       script_val.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_start,
                       (long)script_val.
                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                             _M_impl.super__Vector_impl_data._M_finish -
                       (long)script_val.
                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                             _M_impl.super__Vector_impl_data._M_start);
      if (ret != 0) {
        script_sig._vptr_Script = (_func_int **)0x22e1c0;
        script_sig.script_data_.data_.
        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start._0_4_ = 0x9d4;
        script_sig.script_data_.data_.
        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_finish = "SetTxInFinalScript";
        logger::warn<int&>((CfdSourceLocation *)&script_sig,
                           "wally_psbt_input_set_final_scriptsig NG[{}]",&ret);
        pCVar8 = (CfdException *)__cxa_allocate_exception(0x30);
        ::std::__cxx11::string::string
                  ((string *)&script_sig,"psbt set scriptsig error.",(allocator *)&stacks);
        CfdException::CfdException(pCVar8,kCfdIllegalArgumentError,(string *)&script_sig);
        __cxa_throw(pCVar8,&CfdException::typeinfo,CfdException::~CfdException);
      }
      ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                (&script_val.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
      ScriptBuilder::~ScriptBuilder((ScriptBuilder *)&script);
      Script::~Script((Script *)&last_stack);
    }
  }
  AbstractTxOut::~AbstractTxOut(&utxo.super_AbstractTxOut);
  Script::~Script(&redeem_script);
  return;
}

Assistant:

void Psbt::SetTxInFinalScript(
    uint32_t index, const std::vector<ByteData> &unlocking_script) {
  CheckTxInIndex(index, __LINE__, __FUNCTION__);
  struct wally_psbt *psbt_pointer;
  psbt_pointer = static_cast<struct wally_psbt *>(wally_psbt_pointer_);

  if (unlocking_script.empty()) {
    warn(CFD_LOG_SOURCE, "unlocking script is empty.");
    throw CfdException(
        kCfdIllegalArgumentError, "psbt unlocking script is empty.");
  }
  bool is_witness = false;
  auto redeem_script = GetTxInRedeemScript(index, true);

  auto utxo = GetTxInUtxo(index, true, &is_witness);
  bool is_wsh = false;
  int ret;
  if (is_witness) {
    auto last_stack = unlocking_script.back();
    if (redeem_script.GetData().Equals(last_stack)) {
      is_wsh = true;
    } else if (Pubkey::IsValid(last_stack)) {
      // p2wpkh
    } else {
      warn(CFD_LOG_SOURCE, "invalid unlocking_script.");
      throw CfdException(
          kCfdIllegalArgumentError, "psbt invalid unlocking_script error.");
    }

    struct wally_tx_witness_stack *stacks = nullptr;
    ret = wally_tx_witness_stack_init_alloc(unlocking_script.size(), &stacks);
    if (ret != WALLY_OK) {
      warn(CFD_LOG_SOURCE, "wally_tx_witness_stack_init_alloc NG[{}]", ret);
      throw CfdException(
          kCfdIllegalArgumentError, "psbt init witness stack error.");
    }
    for (auto script : unlocking_script) {
      auto script_val = script.GetBytes();
      ret = wally_tx_witness_stack_add(
          stacks, script_val.data(), script_val.size());
      if (ret != WALLY_OK) {
        wally_tx_witness_stack_free(stacks);
        warn(CFD_LOG_SOURCE, "wally_tx_witness_stack_add NG[{}]", ret);
        throw CfdException(
            kCfdIllegalArgumentError, "psbt add witness stack error.");
      }
    }

    ret = wally_psbt_input_set_final_witness(
        &psbt_pointer->inputs[index], stacks);
    wally_tx_witness_stack_free(stacks);
    if (ret != WALLY_OK) {
      warn(CFD_LOG_SOURCE, "wally_psbt_input_set_final_witness NG[{}]", ret);
      throw CfdException(
          kCfdIllegalArgumentError, "psbt set witness script error.");
    }
  } else {
    Script script_sig;
    if (unlocking_script.size() == 1) {
      script_sig = Script(unlocking_script[0]);
    } else {
      ScriptBuilder build;
      for (auto script : unlocking_script) {
        auto script_val = script.GetBytes();
        if (script_val.size() == 1) {
          build.AppendOperator(static_cast<ScriptType>(script_val[0]));
        } else {
          build.AppendData(script);
        }
      }
      script_sig = build.Build();
    }
    auto sig_val = script_sig.GetData().GetBytes();
    ret = wally_psbt_input_set_final_scriptsig(
        &psbt_pointer->inputs[index], sig_val.data(), sig_val.size());
    if (ret != WALLY_OK) {
      warn(CFD_LOG_SOURCE, "wally_psbt_input_set_final_scriptsig NG[{}]", ret);
      throw CfdException(
          kCfdIllegalArgumentError, "psbt set scriptsig error.");
    }
  }

  if (is_witness && utxo.GetLockingScript().IsP2shScript()) {
    Script locking_script;
    if (is_wsh) {
      locking_script = ScriptUtil::CreateP2wshLockingScript(redeem_script);
    } else if (redeem_script.IsEmpty()) {
      auto key = GetTxInKeyData(index, true);
      locking_script = ScriptUtil::CreateP2wpkhLockingScript(key.GetPubkey());
    } else {
      locking_script = redeem_script;  // p2wpkh locking script
    }
    ScriptBuilder builder;
    builder.AppendData(locking_script.GetData());
    auto sig_val = builder.Build().GetData().GetBytes();
    ret = wally_psbt_input_set_final_scriptsig(
        &psbt_pointer->inputs[index], sig_val.data(), sig_val.size());
    if (ret != WALLY_OK) {
      warn(CFD_LOG_SOURCE, "wally_psbt_input_set_final_scriptsig NG[{}]", ret);
      throw CfdException(
          kCfdIllegalArgumentError, "psbt set scriptsig error.");
    }
  }
}